

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Segment * randomReflection(Segment *__return_storage_ptr__,Segment *segment,Plane *plane)

{
  float fVar1;
  float fVar2;
  double dVar3;
  Point PVar4;
  undefined8 local_e0;
  float local_d8;
  Vector local_b0 [5];
  undefined1 local_74 [8];
  Vector v;
  float s;
  float u;
  float alpha;
  Vector N;
  float local_48;
  undefined1 local_24 [8];
  Vector ri;
  Plane *plane_local;
  Segment *segment_local;
  
  ri._4_8_ = plane;
  PVar4 = operator-(segment->a,&segment->b);
  N._4_8_ = PVar4._0_8_;
  local_24._0_4_ = N.y;
  local_24._4_4_ = N.z;
  local_48 = PVar4.z;
  ri.x = local_48;
  _u = *(undefined8 *)(ri._4_8_ + 0xc);
  N.x = *(float *)(ri._4_8_ + 0x14);
  unique0x10000230 = PVar4;
  fVar1 = randFloat(0.0,6.2831855);
  v.z = randFloat(-1.0,1.0);
  dVar3 = sqrt(1.0 - (double)(v.z * v.z));
  v.y = (float)dVar3;
  dVar3 = sin((double)fVar1);
  local_74._0_4_ = (float)(dVar3 * (double)v.y);
  dVar3 = cos((double)fVar1);
  local_74._4_4_ = (float)(dVar3 * (double)v.y);
  v.x = v.z;
  fVar1 = dotProduct((Vector *)local_24,(Vector *)&u);
  fVar2 = dotProduct((Vector *)local_74,(Vector *)&u);
  if (fVar1 * fVar2 < 0.0) {
    PVar4.z = v.x;
    PVar4.x = (float)local_74._0_4_;
    PVar4.y = (float)local_74._4_4_;
    PVar4 = operator*(PVar4,-1.0);
    local_b0[0]._0_8_ = PVar4._0_8_;
    local_b0[0].z = PVar4.z;
    local_74._0_4_ = local_b0[0].x;
    local_74._4_4_ = local_b0[0].y;
    v.x = local_b0[0].z;
  }
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar1 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar1;
  PVar4 = operator+(segment->b,(Point *)local_74);
  local_e0 = PVar4._0_8_;
  (__return_storage_ptr__->b).x = (float)(undefined4)local_e0;
  (__return_storage_ptr__->b).y = (float)local_e0._4_4_;
  local_d8 = PVar4.z;
  (__return_storage_ptr__->b).z = local_d8;
  return __return_storage_ptr__;
}

Assistant:

Segment randomReflection(Segment const& segment, Plane const& plane)
{
  Vector ri = segment.a - segment.b;

  Vector N = plane.normal;

  float alpha = randFloat(0.0, M_PI*2);
  float u = randFloat(-1.0, 1.0);
  float s = std::sqrt(1.0-u*u);
  Vector v = {static_cast<float>(sin(alpha)*s), static_cast<float>(cos(alpha)*s), u};
  if (dotProduct(ri, N)*dotProduct(v, N)<0)
  {
    v = v*(-1.0);
  }
  return {segment.b, segment.b + v};
}